

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft_world.cc
# Opt level: O0

void sptk::world::cftf081(double *a,double *w)

{
  long in_RSI;
  double *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double x3i;
  double x3r;
  double x2i;
  double x2r;
  double x1i;
  double x1r;
  double x0i;
  double x0r;
  double wn4r;
  double y7i;
  double y7r;
  double y6i;
  double y6r;
  double y5i;
  double y5r;
  double y4i;
  double y4r;
  double y3i;
  double y3r;
  double y2i;
  double y2r;
  double y1i;
  double y1r;
  double y0i;
  double y0r;
  
  dVar18 = *(double *)(in_RSI + 8);
  dVar1 = *in_RDI + in_RDI[8] + in_RDI[4] + in_RDI[0xc];
  dVar2 = in_RDI[1] + in_RDI[9] + in_RDI[5] + in_RDI[0xd];
  dVar3 = (*in_RDI + in_RDI[8]) - (in_RDI[4] + in_RDI[0xc]);
  dVar4 = (in_RDI[1] + in_RDI[9]) - (in_RDI[5] + in_RDI[0xd]);
  dVar5 = (*in_RDI - in_RDI[8]) - (in_RDI[5] - in_RDI[0xd]);
  dVar6 = (in_RDI[1] - in_RDI[9]) + (in_RDI[4] - in_RDI[0xc]);
  dVar7 = (*in_RDI - in_RDI[8]) + (in_RDI[5] - in_RDI[0xd]);
  dVar8 = (in_RDI[1] - in_RDI[9]) - (in_RDI[4] - in_RDI[0xc]);
  dVar9 = in_RDI[2] + in_RDI[10] + in_RDI[6] + in_RDI[0xe];
  dVar10 = in_RDI[3] + in_RDI[0xb] + in_RDI[7] + in_RDI[0xf];
  dVar11 = (in_RDI[2] + in_RDI[10]) - (in_RDI[6] + in_RDI[0xe]);
  dVar12 = (in_RDI[3] + in_RDI[0xb]) - (in_RDI[7] + in_RDI[0xf]);
  dVar13 = (in_RDI[2] - in_RDI[10]) - (in_RDI[7] - in_RDI[0xf]);
  dVar14 = (in_RDI[3] - in_RDI[0xb]) + (in_RDI[6] - in_RDI[0xe]);
  dVar15 = (in_RDI[2] - in_RDI[10]) + (in_RDI[7] - in_RDI[0xf]);
  dVar16 = (in_RDI[3] - in_RDI[0xb]) - (in_RDI[6] - in_RDI[0xe]);
  dVar17 = dVar18 * (dVar13 - dVar14);
  dVar13 = dVar18 * (dVar13 + dVar14);
  dVar14 = dVar18 * (dVar15 - dVar16);
  dVar18 = dVar18 * (dVar15 + dVar16);
  in_RDI[8] = dVar5 + dVar17;
  in_RDI[9] = dVar6 + dVar13;
  in_RDI[10] = dVar5 - dVar17;
  in_RDI[0xb] = dVar6 - dVar13;
  in_RDI[0xc] = dVar7 - dVar18;
  in_RDI[0xd] = dVar8 + dVar14;
  in_RDI[0xe] = dVar7 + dVar18;
  in_RDI[0xf] = dVar8 - dVar14;
  *in_RDI = dVar1 + dVar9;
  in_RDI[1] = dVar2 + dVar10;
  in_RDI[2] = dVar1 - dVar9;
  in_RDI[3] = dVar2 - dVar10;
  in_RDI[4] = dVar3 - dVar12;
  in_RDI[5] = dVar4 + dVar11;
  in_RDI[6] = dVar3 + dVar12;
  in_RDI[7] = dVar4 - dVar11;
  return;
}

Assistant:

void cftf081(double *a, double *w) {
  double wn4r, x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i,
    y0r, y0i, y1r, y1i, y2r, y2i, y3r, y3i,
    y4r, y4i, y5r, y5i, y6r, y6i, y7r, y7i;

  wn4r = w[1];
  x0r = a[0] + a[8];
  x0i = a[1] + a[9];
  x1r = a[0] - a[8];
  x1i = a[1] - a[9];
  x2r = a[4] + a[12];
  x2i = a[5] + a[13];
  x3r = a[4] - a[12];
  x3i = a[5] - a[13];
  y0r = x0r + x2r;
  y0i = x0i + x2i;
  y2r = x0r - x2r;
  y2i = x0i - x2i;
  y1r = x1r - x3i;
  y1i = x1i + x3r;
  y3r = x1r + x3i;
  y3i = x1i - x3r;
  x0r = a[2] + a[10];
  x0i = a[3] + a[11];
  x1r = a[2] - a[10];
  x1i = a[3] - a[11];
  x2r = a[6] + a[14];
  x2i = a[7] + a[15];
  x3r = a[6] - a[14];
  x3i = a[7] - a[15];
  y4r = x0r + x2r;
  y4i = x0i + x2i;
  y6r = x0r - x2r;
  y6i = x0i - x2i;
  x0r = x1r - x3i;
  x0i = x1i + x3r;
  x2r = x1r + x3i;
  x2i = x1i - x3r;
  y5r = wn4r * (x0r - x0i);
  y5i = wn4r * (x0r + x0i);
  y7r = wn4r * (x2r - x2i);
  y7i = wn4r * (x2r + x2i);
  a[8] = y1r + y5r;
  a[9] = y1i + y5i;
  a[10] = y1r - y5r;
  a[11] = y1i - y5i;
  a[12] = y3r - y7i;
  a[13] = y3i + y7r;
  a[14] = y3r + y7i;
  a[15] = y3i - y7r;
  a[0] = y0r + y4r;
  a[1] = y0i + y4i;
  a[2] = y0r - y4r;
  a[3] = y0i - y4i;
  a[4] = y2r - y6i;
  a[5] = y2i + y6r;
  a[6] = y2r + y6i;
  a[7] = y2i - y6r;
}